

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O3

bool is_same(vector<double,_std::allocator<double>_> *vec1,
            vector<double,_std::allocator<double>_> *vec2)

{
  double dVar1;
  pointer pdVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  double dVar8;
  
  pdVar2 = (vec1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar3 = 0;
  iVar4 = 0;
  lVar6 = (long)(vec1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar2;
  if (lVar6 != 0) {
    uVar7 = 0;
    dVar8 = 0.0;
    uVar5 = 0;
    do {
      dVar1 = pdVar2[uVar7];
      if (dVar8 < dVar1) {
        uVar5 = uVar7 & 0xffffffff;
      }
      iVar4 = (int)uVar5;
      if (dVar1 <= dVar8) {
        dVar1 = dVar8;
      }
      dVar8 = dVar1;
      uVar7 = uVar7 + 1;
    } while ((uVar7 & 0xffffffff) < (ulong)(lVar6 >> 3));
  }
  pdVar2 = (vec2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar6 = (long)(vec2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar2;
  if (lVar6 != 0) {
    uVar7 = 0;
    dVar8 = 0.0;
    uVar5 = 0;
    do {
      dVar1 = pdVar2[uVar7];
      if (dVar8 < dVar1) {
        uVar5 = uVar7 & 0xffffffff;
      }
      iVar3 = (int)uVar5;
      if (dVar1 <= dVar8) {
        dVar1 = dVar8;
      }
      dVar8 = dVar1;
      uVar7 = uVar7 + 1;
    } while ((uVar7 & 0xffffffff) < (ulong)(lVar6 >> 3));
  }
  return iVar4 == iVar3;
}

Assistant:

bool is_same(const std::vector<double>& vec1, const std::vector<double>& vec2){
    return max_index(vec1)==max_index(vec2);
}